

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qshaderdescription.cpp
# Opt level: O0

void serializeInOutVar(QDataStream *stream,InOutVariable *v,int version)

{
  bool bVar1;
  qsizetype qVar2;
  const_iterator o;
  int in_EDX;
  BlockVariable *in_RSI;
  QDataStream *in_RDI;
  long in_FS_OFFSET;
  BlockVariable *sv;
  QList<QShaderDescription::BlockVariable> *__range2;
  const_iterator __end2;
  const_iterator __begin2;
  QByteArray *in_stack_ffffffffffffff90;
  QDataStream *this;
  undefined8 in_stack_ffffffffffffffa0;
  int version_00;
  InOutVariable *in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffb0;
  QDataStream *stream_00;
  const_iterator local_28;
  undefined1 local_20 [24];
  long local_8;
  
  version_00 = (int)((ulong)in_stack_ffffffffffffffa0 >> 0x20);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this = in_RDI;
  QString::fromUtf8<void>(in_stack_ffffffffffffff90);
  operator<<(in_RDI,(QString *)local_20);
  QString::~QString((QString *)0x6e1d02);
  QDataStream::operator<<(this,in_RSI->type);
  serializeDecorations
            ((QDataStream *)CONCAT44(in_EDX,in_stack_ffffffffffffffb0),in_stack_ffffffffffffffa8,
             version_00);
  if (8 < in_EDX) {
    stream_00 = this;
    qVar2 = QList<QShaderDescription::BlockVariable>::size(&in_RSI->structMembers);
    QDataStream::operator<<(this,(int)qVar2);
    local_28.i = (BlockVariable *)&DAT_aaaaaaaaaaaaaaaa;
    local_28 = QList<QShaderDescription::BlockVariable>::begin
                         ((QList<QShaderDescription::BlockVariable> *)this);
    o = QList<QShaderDescription::BlockVariable>::end
                  ((QList<QShaderDescription::BlockVariable> *)this);
    while (bVar1 = QList<QShaderDescription::BlockVariable>::const_iterator::operator!=(&local_28,o)
          , bVar1) {
      QList<QShaderDescription::BlockVariable>::const_iterator::operator*(&local_28);
      serializeBlockMemberVar(stream_00,in_RSI);
      QList<QShaderDescription::BlockVariable>::const_iterator::operator++(&local_28);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

static void serializeInOutVar(QDataStream *stream, const QShaderDescription::InOutVariable &v,
                              int version)
{
    (*stream) << QString::fromUtf8(v.name);
    (*stream) << int(v.type);
    serializeDecorations(stream, v, version);
    if (version > QShaderPrivate::QSB_VERSION_WITHOUT_INPUT_OUTPUT_INTERFACE_BLOCKS) {
        (*stream) << int(v.structMembers.size());
        for (const QShaderDescription::BlockVariable &sv : v.structMembers)
            serializeBlockMemberVar(stream, sv);
    }
}